

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O0

int localSync(mpt_output *out,int timeout)

{
  mpt_output *pmVar1;
  int timeout_local;
  mpt_output *out_local;
  
  pmVar1 = localPassOutput((mpt_local_output *)(out + -2));
  if (pmVar1 == (mpt_output *)0x0) {
    out_local._4_4_ = -4;
  }
  else {
    out_local._4_4_ = (*pmVar1->_vptr->sync)(pmVar1,timeout);
  }
  return out_local._4_4_;
}

Assistant:

static int localSync(MPT_INTERFACE(output) *out, int timeout)
{
	if (!(out = localPassOutput(MPT_baseaddr(local_output, out, _out)))) {
		return MPT_ERROR(BadOperation);
	}
	return out->_vptr->sync(out, timeout);
}